

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O1

int av1_calc_refresh_idx_for_intnl_arf
              (AV1_COMP *cpi,RefFrameMapPair *ref_frame_map_pairs,int gf_index)

{
  AV1_PRIMARY *pAVar1;
  int idx;
  int iVar2;
  long lVar3;
  uint enable_refresh_skip;
  
  pAVar1 = cpi->ppi;
  lVar3 = 0;
  do {
    if (ref_frame_map_pairs[lVar3].disp_order == -1) goto LAB_003bd31f;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  lVar3 = 0xffffffff;
LAB_003bd31f:
  if ((int)lVar3 != -1) {
    return (int)lVar3;
  }
  enable_refresh_skip = 1;
  if ((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (pAVar1->lap_enabled == 0)) &&
     ((cpi->oxcf).mode == '\x01')) {
    enable_refresh_skip = (uint)((cpi->oxcf).gf_cfg.lag_in_frames != 0);
  }
  iVar2 = get_refresh_idx(ref_frame_map_pairs,0,&pAVar1->gf_group,gf_index,enable_refresh_skip,
                          (pAVar1->gf_group).display_idx[gf_index]);
  return iVar2;
}

Assistant:

int av1_calc_refresh_idx_for_intnl_arf(
    AV1_COMP *cpi, RefFrameMapPair ref_frame_map_pairs[REF_FRAMES],
    int gf_index) {
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;

  // Search for the open slot to store the current frame.
  int free_fb_index = get_free_ref_map_index(ref_frame_map_pairs);

  // Use a free slot if available.
  if (free_fb_index != INVALID_IDX) {
    return free_fb_index;
  } else {
    int enable_refresh_skip = !is_one_pass_rt_params(cpi);
    int refresh_idx =
        get_refresh_idx(ref_frame_map_pairs, 0, gf_group, gf_index,
                        enable_refresh_skip, gf_group->display_idx[gf_index]);
    return refresh_idx;
  }
}